

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

CharSetNode * __thiscall
UnifiedRegex::CharSetInner::Set
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CharSetNode *pCVar6;
  undefined4 extraout_var_02;
  long lVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  _func_int **pp_Var11;
  uint level_00;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x1b1,"(level > 0)","level > 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar8 = (char)level * '\x04' + 4;
  uVar12 = l >> (bVar8 & 0x1f) & 0xf;
  uVar13 = (ulong)uVar12;
  level_00 = level - 1;
  uVar14 = h >> (bVar8 & 0x1f) & 0xf;
  pCVar6 = this->children[uVar13];
  if (uVar12 == uVar14) {
    if (pCVar6 == (CharSetNode *)0x0) {
      uVar12 = -1 << ((char)level_00 * '\x04' + 8U & 0x1f);
      if (((~uVar12 & l) != 0) || ((uVar12 | 0xffffffe - h) != 0xffffffff)) {
        pCVar6 = CharSetNode::For(allocator,level_00);
        this->children[uVar13] = pCVar6;
        pp_Var11 = pCVar6->_vptr_CharSetNode;
        uVar10 = (ulong)l;
        uVar9 = uVar13;
LAB_00e6d6fd:
        iVar4 = (*pp_Var11[2])(pCVar6,allocator,(ulong)level_00,uVar10,(ulong)h);
        this->children[uVar9] = (CharSetNode *)CONCAT44(extraout_var_02,iVar4);
        bVar3 = false;
        goto LAB_00e6d70b;
      }
      pCVar6 = (CharSetNode *)&CharSetFull::Instance;
    }
    else {
      iVar4 = (*pCVar6->_vptr_CharSetNode[2])(pCVar6,allocator,(ulong)level_00,(ulong)l,(ulong)h);
      pCVar6 = (CharSetNode *)CONCAT44(extraout_var,iVar4);
    }
    this->children[uVar13] = pCVar6;
    bVar3 = true;
  }
  else {
    cVar2 = (char)level_00 * '\x04';
    uVar15 = ~(-1 << (cVar2 + 8U & 0x1f));
    bVar3 = true;
    if (pCVar6 == (CharSetNode *)0x0) {
      if ((uVar15 & l) != 0) {
        pCVar6 = CharSetNode::For(allocator,level_00);
        this->children[uVar13] = pCVar6;
        bVar3 = false;
        goto LAB_00e6d5d7;
      }
      bVar3 = true;
      pCVar6 = (CharSetNode *)&CharSetFull::Instance;
    }
    else {
LAB_00e6d5d7:
      iVar4 = (*pCVar6->_vptr_CharSetNode[2])
                        (pCVar6,allocator,(ulong)level_00,(ulong)l,(ulong)uVar15);
      pCVar6 = (CharSetNode *)CONCAT44(extraout_var_00,iVar4);
    }
    this->children[uVar13] = pCVar6;
    uVar9 = (ulong)uVar14;
    if (uVar12 + 1 < uVar14) {
      do {
        pCVar6 = this->children[uVar13 + 1];
        if (pCVar6 != (CharSetNode *)0x0) {
          (**pCVar6->_vptr_CharSetNode)(pCVar6,allocator);
        }
        this->children[uVar13 + 1] = (CharSetNode *)&CharSetFull::Instance;
        uVar13 = uVar13 + 1;
      } while (uVar9 - 1 != uVar13);
    }
    pCVar6 = this->children[uVar9];
    if (pCVar6 == (CharSetNode *)0x0) {
      if ((0xffffffe - h | -1 << (cVar2 + 8U & 0x1f)) != 0xffffffff) {
        pCVar6 = CharSetNode::For(allocator,level_00);
        this->children[uVar9] = pCVar6;
        pp_Var11 = pCVar6->_vptr_CharSetNode;
        uVar10 = 0;
        goto LAB_00e6d6fd;
      }
      pCVar6 = (CharSetNode *)&CharSetFull::Instance;
    }
    else {
      iVar4 = (*pCVar6->_vptr_CharSetNode[2])(pCVar6,allocator,(ulong)level_00,0,(ulong)h);
      pCVar6 = (CharSetNode *)CONCAT44(extraout_var_01,iVar4);
    }
    this->children[uVar9] = pCVar6;
  }
LAB_00e6d70b:
  if (bVar3) {
    lVar7 = 1;
    do {
      if (this->children[lVar7 + -1] != (CharSetNode *)&CharSetFull::Instance) {
        return &this->super_CharSetNode;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x11);
    FreeSelf(this,allocator);
    this = (CharSetInner *)&CharSetFull::Instance;
  }
  return &this->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetInner::Set(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level > 0);
        uint li = innerIdx(level, l);
        uint hi = innerIdx(level--, h);
        bool couldBeFull = true;
        if (li == hi)
        {
            if (children[li] == nullptr)
            {
                if (remain(level, l) == 0 && remain(level, h + 1) == 0)
                    children[li] = CharSetFull::TheFullNode;
                else
                {
                    children[li] = For(allocator, level);
                    children[li] = children[li]->Set(allocator, level, l, h);
                    couldBeFull = false;
                }
            }
            else
                children[li] = children[li]->Set(allocator, level, l, h);
        }
        else
        {
            if (children[li] == nullptr)
            {
                if (remain(level, l) == 0)
                    children[li] = CharSetFull::TheFullNode;
                else
                {
                    children[li] = For(allocator, level);
                    children[li] = children[li]->Set(allocator, level, l, lim(level));
                    couldBeFull = false;
                }
            }
            else
                children[li] = children[li]->Set(allocator, level, l, lim(level));
            for (uint i = li + 1; i < hi; i++)
            {
                if (children[i] != nullptr)
                    children[i]->FreeSelf(allocator);
                children[i] = CharSetFull::TheFullNode;
            }
            if (children[hi] == nullptr)
            {
                if (remain(level, h + 1) == 0)
                    children[hi] = CharSetFull::TheFullNode;
                else
                {
                    children[hi] = For(allocator, level);
                    children[hi] = children[hi]->Set(allocator, level, 0, h);
                    couldBeFull = false;
                }
            }
            else
                children[hi] = children[hi]->Set(allocator, level, 0, h);
        }
        if (couldBeFull)
        {
            for (uint i = 0; i < branchingPerInnerLevel; i++)
            {
                if (children[i] != CharSetFull::TheFullNode)
                    return this;
            }
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }